

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

void __thiscall
Inferences::InductionClauseIterator::performInfIntInduction
          (InductionClauseIterator *this,InductionContext *context,bool increasing,
          TermLiteralClause *bound)

{
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  Literal *bound1;
  TermLiteralClause *bound1_00;
  Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
  bound1_01;
  bool bVar4;
  bool increasing_00;
  Literal *bound2;
  undefined7 in_register_00000011;
  TermLiteralClause *bound2_00;
  Entry *e;
  __alloc_node_gen_t __alloc_node_gen;
  Entry *local_110;
  undefined4 local_104;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_100;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>_>_>
  local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined7 uStack_e7;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined4 uStack_d8;
  InductionContext local_d0;
  InductionContext local_80;
  
  local_110 = (Entry *)0x0;
  std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::vector
            (&local_80._indTerms,&context->_indTerms);
  puVar1 = &local_80._cls;
  local_100 = &(context->_cls)._M_h;
  local_80._cls._M_h._M_buckets = (__buckets_ptr)0x0;
  local_80._cls._M_h._M_bucket_count = (context->_cls)._M_h._M_bucket_count;
  local_80._cls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._cls._M_h._M_element_count = (context->_cls)._M_h._M_element_count;
  local_80._cls._M_h._M_rehash_policy._M_max_load_factor =
       (context->_cls)._M_h._M_rehash_policy._M_max_load_factor;
  local_80._cls._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(context->_cls)._M_h._M_rehash_policy.field_0x4;
  local_80._cls._M_h._M_rehash_policy._M_next_resize =
       (context->_cls)._M_h._M_rehash_policy._M_next_resize;
  local_80._cls._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_h._0_1_ = (byte)puVar1;
  local_f8._M_h._1_7_ = (undefined7)((ulong)puVar1 >> 8);
  std::
  _Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,true>>>>
            ((_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,local_100,&local_f8);
  local_104 = (undefined4)CONCAT71(in_register_00000011,increasing);
  bound2 = bound->literal;
  bound1 = (Literal *)0x0;
  if (increasing) {
    bound2 = (Literal *)0x0;
    bound1 = bound->literal;
  }
  bVar4 = notDoneInt(this,&local_80,bound1,bound2,&local_110);
  std::
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&puVar1->_M_h);
  if (local_80._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80._indTerms.
                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80._indTerms.
                          super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80._indTerms.
                          super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  increasing_00 = SUB41(local_104,0);
  if (bVar4) {
    uVar2 = (bound->term).super_TermList._content;
    uVar3 = (bound->term)._sort._content;
    uStack_e7 = SUB87(bound->literal,0);
    uStack_e0 = (undefined1)((ulong)bound->literal >> 0x38);
    uStack_df = SUB87(bound->clause,0);
    uStack_d8._0_1_ = (undefined1)((ulong)bound->clause >> 0x38);
    local_f8._M_h._1_7_ = (undefined7)uVar2;
    uStack_f0 = (undefined1)(uVar2 >> 0x38);
    uStack_ef = (undefined7)uVar3;
    uStack_e8 = (undefined1)(uVar3 >> 0x38);
    bound1_01._inner._content[8] = (undefined1)uStack_ef;
    bound1_01._inner._content[9] = uStack_ef._1_1_;
    bound1_01._inner._content[10] = uStack_ef._2_1_;
    bound1_01._inner._content[0xb] = uStack_ef._3_1_;
    bound1_01._inner._content[0xc] = uStack_ef._4_1_;
    bound1_01._inner._content[0xd] = uStack_ef._5_1_;
    bound1_01._inner._content[0xe] = uStack_ef._6_1_;
    bound1_01._inner._content[7] = uStack_f0;
    bound1_01._inner._content[0x10] = (undefined1)uStack_e7;
    bound1_01._inner._content[0x11] = uStack_e7._1_1_;
    bound1_01._inner._content[0x12] = uStack_e7._2_1_;
    bound1_01._inner._content[0x13] = uStack_e7._3_1_;
    bound1_01._inner._content[0x14] = uStack_e7._4_1_;
    bound1_01._inner._content[0x15] = uStack_e7._5_1_;
    bound1_01._inner._content[0x16] = uStack_e7._6_1_;
    bound1_01._inner._content[0xf] = uStack_e8;
    bound1_01._inner._content[0x18] = (undefined1)uStack_df;
    bound1_01._inner._content[0x19] = uStack_df._1_1_;
    bound1_01._inner._content[0x1a] = uStack_df._2_1_;
    bound1_01._inner._content[0x1b] = uStack_df._3_1_;
    bound1_01._inner._content[0x1c] = uStack_df._4_1_;
    bound1_01._inner._content[0x1d] = uStack_df._5_1_;
    bound1_01._inner._content[0x1e] = uStack_df._6_1_;
    bound1_01._inner._content[0x17] = uStack_e0;
    bound1_01._inner._0_8_ = CONCAT71(local_f8._M_h._1_7_,(byte)local_f8._M_h) & 0xfffffffffffffffe;
    bound1_01._inner._32_4_ = uStack_d8;
    local_f8._M_h._0_1_ = (byte)local_f8._M_h & 0xfe;
    performIntInduction(this,context,local_110,increasing_00,bound1_01,(TermLiteralClause *)0x0);
  }
  std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::vector
            (&local_d0._indTerms,&context->_indTerms);
  puVar1 = &local_d0._cls;
  local_d0._cls._M_h._M_buckets = (__buckets_ptr)0x0;
  local_d0._cls._M_h._M_bucket_count = (context->_cls)._M_h._M_bucket_count;
  local_d0._cls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d0._cls._M_h._M_element_count = (context->_cls)._M_h._M_element_count;
  local_d0._cls._M_h._M_rehash_policy._M_max_load_factor =
       (context->_cls)._M_h._M_rehash_policy._M_max_load_factor;
  local_d0._cls._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(context->_cls)._M_h._M_rehash_policy.field_0x4;
  local_d0._cls._M_h._M_rehash_policy._M_next_resize =
       (context->_cls)._M_h._M_rehash_policy._M_next_resize;
  local_d0._cls._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_h._0_1_ = (byte)puVar1;
  local_f8._M_h._1_7_ = (undefined7)((ulong)puVar1 >> 8);
  std::
  _Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,true>>>>
            ((_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,local_100,&local_f8);
  bound2_00 = bound;
  bound1_00 = (TermLiteralClause *)0x0;
  if (increasing_00 != false) {
    bound2_00 = (TermLiteralClause *)0x0;
    bound1_00 = bound;
  }
  resolveClauses(this,&local_d0,local_110,bound1_00,bound2_00);
  std::
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&puVar1->_M_h);
  if (local_d0._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0._indTerms.
                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0._indTerms.
                          super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0._indTerms.
                          super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InductionClauseIterator::performInfIntInduction(const InductionContext& context, bool increasing, const TermLiteralClause& bound)
{
  InductionFormulaIndex::Entry* e = nullptr;
  if (notDoneInt(context, increasing ? bound.literal : nullptr, increasing ? nullptr : bound.literal, e)) {
    performIntInduction(context, e, increasing, bound, nullptr);
  }
  resolveClauses(context, e, increasing ? &bound : nullptr, increasing ? nullptr : &bound);
}